

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

void __thiscall QPDFNumberTreeObjectHelper::iterator::updateIValue(iterator *this)

{
  bool bVar1;
  element_type *peVar2;
  pointer pTVar3;
  longlong lVar4;
  QPDFObjectHandle local_90 [2];
  undefined1 local_70 [8];
  element_type p;
  iterator *this_local;
  
  p.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar2 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->impl);
  bVar1 = NNTreeIterator::valid(peVar2);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->impl);
    NNTreeIterator::NNTreeIterator((NNTreeIterator *)local_70,peVar2);
    pTVar3 = NNTreeIterator::operator->((NNTreeIterator *)local_70);
    lVar4 = QPDFObjectHandle::getIntValue(&pTVar3->first);
    (this->ivalue).first = lVar4;
    pTVar3 = NNTreeIterator::operator->((NNTreeIterator *)local_70);
    QPDFObjectHandle::operator=(&(this->ivalue).second,&pTVar3->second);
    NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_70);
  }
  else {
    (this->ivalue).first = 0;
    memset(local_90,0,0x10);
    QPDFObjectHandle::QPDFObjectHandle(local_90);
    QPDFObjectHandle::operator=(&(this->ivalue).second,local_90);
    QPDFObjectHandle::~QPDFObjectHandle(local_90);
  }
  return;
}

Assistant:

void
QPDFNumberTreeObjectHelper::iterator::updateIValue()
{
    if (impl->valid()) {
        auto p = *impl;
        this->ivalue.first = p->first.getIntValue();
        this->ivalue.second = p->second;
    } else {
        this->ivalue.first = 0;
        this->ivalue.second = QPDFObjectHandle();
    }
}